

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  char *pcVar1;
  byte bVar2;
  size_t dictSize;
  size_t sVar3;
  ushort uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  LZ4_byte *pLVar8;
  ushort *puVar9;
  ulong uVar10;
  LZ4_byte *__src;
  uint uVar11;
  size_t l;
  long lVar12;
  ulong uVar13;
  LZ4_byte *pLVar14;
  byte *__src_00;
  ushort *puVar15;
  LZ4_byte *pLVar16;
  char *__dest;
  size_t l_1;
  LZ4_byte *__n;
  int local_48;
  
  dictSize = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (dictSize == 0) {
    iVar5 = LZ4_decompress_fast(source,dest,originalSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      sVar3 = (LZ4_streamDecode->internal_donotuse).extDictSize;
      lVar6 = (long)originalSize;
      pcVar1 = dest + lVar6;
      lVar7 = (long)dest - dictSize;
      pLVar8 = (LZ4_streamDecode->internal_donotuse).externalDict;
      puVar9 = (ushort *)source;
      do {
        uVar4 = *puVar9;
        __src_00 = (byte *)((long)puVar9 + 1);
        uVar11 = (uint)(byte)((byte)uVar4 >> 4);
        uVar13 = (ulong)uVar11;
        if (uVar11 == 0xf) {
          lVar12 = 0;
          do {
            bVar2 = *__src_00;
            __src_00 = __src_00 + 1;
            lVar12 = lVar12 + (ulong)bVar2;
          } while ((ulong)bVar2 == 0xff);
          uVar13 = lVar12 + 0xf;
        }
        if ((ulong)((long)pcVar1 - (long)dest) < uVar13) {
          return -1;
        }
        memmove(dest,__src_00,uVar13);
        __dest = dest + uVar13;
        puVar15 = (ushort *)(__src_00 + uVar13);
        if (pcVar1 + -(long)__dest < (LZ4_byte *)0xc) {
          if (__dest != pcVar1) {
            return -1;
          }
          local_48 = (int)source;
          local_48 = (int)puVar15 - local_48;
          if (0 < local_48) {
            (LZ4_streamDecode->internal_donotuse).prefixSize =
                 (LZ4_streamDecode->internal_donotuse).prefixSize + lVar6;
            (LZ4_streamDecode->internal_donotuse).prefixEnd =
                 (LZ4_streamDecode->internal_donotuse).prefixEnd + lVar6;
            return local_48;
          }
          return local_48;
        }
        uVar13 = (ulong)((byte)uVar4 & 0xf);
        puVar9 = puVar15 + 1;
        if (uVar13 == 0xf) {
          lVar12 = 0;
          do {
            uVar4 = *puVar9;
            puVar9 = (ushort *)((long)puVar9 + 1);
            lVar12 = lVar12 + (ulong)(byte)uVar4;
          } while ((ulong)(byte)uVar4 == 0xff);
          uVar13 = lVar12 + 0xf;
        }
        __n = (LZ4_byte *)(uVar13 + 4);
        if (pcVar1 + -(long)__dest < __n) {
          return -1;
        }
        uVar13 = (ulong)*puVar15;
        uVar10 = (long)__dest - lVar7;
        if (sVar3 + uVar10 < uVar13) {
          return -1;
        }
        if (uVar10 < uVar13) {
          __src = pLVar8 + (uVar10 - uVar13) + sVar3;
          pLVar14 = pLVar8 + (sVar3 - (long)__src);
          pLVar16 = __n + -(long)pLVar14;
          if (__n < pLVar14) {
            memmove(__dest,__src,(size_t)__n);
            pLVar16 = (LZ4_byte *)0x0;
            pLVar14 = __n;
          }
          else {
            memmove(__dest,__src,(size_t)pLVar14);
          }
          __dest = __dest + (long)pLVar14;
          lVar12 = lVar7;
          __n = pLVar16;
        }
        else {
          lVar12 = (long)__dest - uVar13;
        }
        if (__n != (LZ4_byte *)0x0) {
          pLVar14 = (LZ4_byte *)0x0;
          do {
            __dest[(long)pLVar14] = pLVar14[lVar12];
            pLVar14 = pLVar14 + 1;
          } while (__n != pLVar14);
        }
        dest = __dest + (long)__n;
      } while (4 < (ulong)((long)pcVar1 - (long)dest));
      return -1;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = dictSize;
    pLVar8 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -dictSize;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar8;
    iVar5 = LZ4_decompress_fast_extDict(source,dest,originalSize,pLVar8,dictSize);
  }
  if (0 < iVar5) {
    (LZ4_streamDecode->internal_donotuse).prefixSize = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
  }
  return iVar5;
}

Assistant:

LZ4_FORCE_O2 int
LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode,
                        const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* const lz4sd =
        (assert(LZ4_streamDecode!=NULL), &LZ4_streamDecode->internal_donotuse);
    int result;

    DEBUGLOG(5, "LZ4_decompress_fast_continue (toDecodeSize=%i)", originalSize);
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        DEBUGLOG(5, "first invocation : no prefix nor extDict");
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        DEBUGLOG(5, "continue using existing prefix");
        result = LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        lz4sd->prefixSize,
                        lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        DEBUGLOG(5, "prefix becomes extDict");
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}